

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O2

void __thiscall JAMA::Eigenvalue<double>::orthes(Eigenvalue<double> *this)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  pointer pdVar4;
  double *pdVar5;
  double **ppdVar6;
  long lVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double **ppdVar12;
  int i_2;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  long local_48;
  
  uVar1 = this->n;
  uVar11 = (ulong)uVar1;
  lVar17 = (long)(int)uVar1;
  uVar15 = lVar17 - 1;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  uVar10 = uVar11;
  for (uVar18 = 1; (long)uVar18 <= (long)(lVar17 - 2U); uVar18 = uVar18 + 1) {
    ppdVar3 = (this->H).data_;
    dVar21 = 0.0;
    for (uVar9 = uVar18; (long)uVar9 < lVar17; uVar9 = uVar9 + 1) {
      dVar21 = dVar21 + ABS(ppdVar3[uVar9][uVar18 - 1]);
    }
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      pdVar4 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar22 = 0.0;
      for (uVar10 = uVar15; (long)uVar18 <= (long)uVar10; uVar10 = uVar10 - 1) {
        dVar19 = ppdVar3[uVar10 & 0xffffffff][uVar18 - 1] / dVar21;
        pdVar4[uVar10] = dVar19;
        dVar22 = dVar22 + dVar19 * dVar19;
      }
      if (dVar22 < 0.0) {
        dVar19 = sqrt(dVar22);
      }
      else {
        dVar19 = SQRT(dVar22);
      }
      pdVar4 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar20 = pdVar4[uVar18];
      dVar19 = (double)(~-(ulong)(0.0 < dVar20) & (ulong)dVar19 |
                       (ulong)-dVar19 & -(ulong)(0.0 < dVar20));
      dVar22 = dVar22 - dVar20 * dVar19;
      pdVar4[uVar18] = dVar20 - dVar19;
      uVar2 = this->n;
      uVar10 = (ulong)uVar2;
      for (uVar9 = uVar18; (long)uVar9 < (long)(int)uVar2; uVar9 = uVar9 + 1) {
        ppdVar3 = (this->H).data_;
        dVar20 = 0.0;
        for (uVar14 = uVar15; (long)uVar18 <= (long)uVar14; uVar14 = uVar14 - 1) {
          dVar20 = dVar20 + pdVar4[uVar14] * ppdVar3[uVar14 & 0xffffffff][uVar9];
        }
        for (uVar14 = uVar18; uVar11 != uVar14; uVar14 = uVar14 + 1) {
          pdVar5 = ppdVar3[uVar14];
          pdVar5[uVar9] = pdVar4[uVar14] * (-dVar20 / dVar22) + pdVar5[uVar9];
        }
      }
      for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
        ppdVar3 = (this->H).data_;
        dVar20 = 0.0;
        for (uVar14 = uVar15; (long)uVar18 <= (long)uVar14; uVar14 = uVar14 - 1) {
          dVar20 = dVar20 + pdVar4[uVar14] * ppdVar3[uVar9][uVar14 & 0xffffffff];
        }
        for (uVar14 = uVar18; uVar11 != uVar14; uVar14 = uVar14 + 1) {
          pdVar5 = ppdVar3[uVar9];
          pdVar5[uVar14] = pdVar4[uVar14] * (-dVar20 / dVar22) + pdVar5[uVar14];
        }
      }
      pdVar4[uVar18] = pdVar4[uVar18] * dVar21;
      (this->H).data_[uVar18][uVar18 - 1] = dVar19 * dVar21;
    }
  }
  uVar8 = 0;
  uVar15 = 0;
  if (0 < (int)uVar10) {
    uVar15 = uVar10;
  }
  for (; uVar8 != uVar15; uVar8 = uVar8 + 1) {
    ppdVar3 = (this->V).data_;
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      dVar21 = 1.0;
      if (uVar8 != uVar11) {
        dVar21 = 0.0;
      }
      ppdVar3[uVar8][uVar11] = dVar21;
    }
  }
  ppdVar3 = (this->H).data_;
  uVar15 = lVar17 - 2U & 0xffffffff;
  lVar17 = uVar15 * 8;
  local_48 = uVar15 * 8 + 8;
  ppdVar12 = ppdVar3 + uVar15 + 1;
  while (iVar13 = (int)uVar15, 0 < iVar13) {
    uVar8 = uVar15 - 1;
    pdVar5 = ppdVar3[uVar15];
    dVar21 = pdVar5[uVar15 - 1];
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      pdVar4 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar16 = 0; iVar13 + (int)lVar16 < (int)(uVar1 - 1); lVar16 = lVar16 + 1) {
        *(double *)((long)pdVar4 + lVar16 * 8 + local_48) = ppdVar12[lVar16][uVar8];
      }
      pdVar4 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar11 = uVar15; (int)uVar11 < (int)uVar1; uVar11 = uVar11 + 1) {
        ppdVar6 = (this->V).data_;
        dVar21 = 0.0;
        for (lVar16 = 0; iVar13 + (int)lVar16 < (int)uVar1; lVar16 = lVar16 + 1) {
          dVar21 = dVar21 + *(double *)
                             ((long)(this->ort).data_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 8 + lVar17) *
                            *(double *)(*(long *)((long)ppdVar6 + lVar16 * 8 + lVar17) + uVar11 * 8)
          ;
        }
        dVar22 = pdVar4[uVar15];
        dVar19 = pdVar5[uVar8];
        for (lVar16 = 0; iVar13 + (int)lVar16 < (int)uVar1; lVar16 = lVar16 + 1) {
          lVar7 = *(long *)((long)ppdVar6 + lVar16 * 8 + lVar17);
          *(double *)(lVar7 + uVar11 * 8) =
               *(double *)((long)pdVar4 + lVar16 * 8 + lVar17) * ((dVar21 / dVar22) / dVar19) +
               *(double *)(lVar7 + uVar11 * 8);
        }
      }
    }
    ppdVar12 = ppdVar12 + -1;
    local_48 = local_48 + -8;
    lVar17 = lVar17 + -8;
    uVar15 = uVar8;
  }
  return;
}

Assistant:

void orthes() {
      //  This is derived from the Algol procedures orthes and ortran,
      //  by Martin and Wilkinson, Handbook for Auto. Comp.,
      //  Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutines in EISPACK.

      int low  = 0;
      int high = n - 1;

      for (int m = low + 1; m <= high - 1; m++) {
        // Scale column.

        Real scale = 0.0;
        for (int i = m; i <= high; i++) {
          scale = scale + abs(H(i, m - 1));
        }
        if (scale != 0.0) {
          // Compute Householder transformation.

          Real h = 0.0;
          for (int i = high; i >= m; i--) {
            ort(i) = H(i, m - 1) / scale;
            h += ort(i) * ort(i);
          }
          Real g = sqrt(h);
          if (ort(m) > 0) { g = -g; }
          h      = h - ort(m) * g;
          ort(m) = ort(m) - g;

          // Apply Householder similarity transformation
          // H = (I-u*u'/h)*H*(I-u*u')/h)

          for (int j = m; j < n; j++) {
            Real f = 0.0;
            for (int i = high; i >= m; i--) {
              f += ort(i) * H(i, j);
            }
            f = f / h;
            for (int i = m; i <= high; i++) {
              H(i, j) -= f * ort(i);
            }
          }

          for (int i = 0; i <= high; i++) {
            Real f = 0.0;
            for (int j = high; j >= m; j--) {
              f += ort(j) * H(i, j);
            }
            f = f / h;
            for (int j = m; j <= high; j++) {
              H(i, j) -= f * ort(j);
            }
          }
          ort(m)      = scale * ort(m);
          H(m, m - 1) = scale * g;
        }
      }

      // Accumulate transformations (Algol's ortran).

      for (int i = 0; i < n; i++) {
        for (int j = 0; j < n; j++) {
          V(i, j) = (i == j ? 1.0 : 0.0);
        }
      }

      for (int m = high - 1; m >= low + 1; m--) {
        if (H(m, m - 1) != 0.0) {
          for (int i = m + 1; i <= high; i++) {
            ort(i) = H(i, m - 1);
          }
          for (int j = m; j <= high; j++) {
            Real g = 0.0;
            for (int i = m; i <= high; i++) {
              g += ort(i) * V(i, j);
            }
            // Double division avoids possible underflow
            g = (g / ort(m)) / H(m, m - 1);
            for (int i = m; i <= high; i++) {
              V(i, j) += g * ort(i);
            }
          }
        }
      }
    }